

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O0

ssize_t __thiscall MT32Emu::MemoryRegion::write(MemoryRegion *this,int __fd,void *__buf,size_t __n)

{
  byte bVar1;
  ulong uVar2;
  Bit8u *pBVar3;
  uint uVar4;
  uint in_R8D;
  byte in_R9B;
  byte local_3d;
  uint local_3c;
  Bit8u maxValue;
  Bit8u desiredValue;
  uint i;
  Bit8u *dest;
  uint memOff;
  bool init_local;
  uint len_local;
  Bit8u *src_local;
  uint off_local;
  uint entry_local;
  MemoryRegion *this_local;
  
  uVar4 = (uint)__buf;
  dest._4_4_ = __fd * this->entrySize + uVar4;
  uVar2 = (ulong)__buf & 0xffffffff;
  if (uVar4 <= this->entrySize * this->entries - 1) {
    memOff = in_R8D;
    if (this->entrySize * this->entries < uVar4 + in_R8D) {
      memOff = this->entrySize * this->entries - uVar4;
    }
    pBVar3 = getRealMemory(this);
    if (pBVar3 == (Bit8u *)0x0) {
      uVar2 = 0;
    }
    else {
      for (local_3c = 0; uVar2 = (ulong)local_3c, local_3c < memOff; local_3c = local_3c + 1) {
        local_3d = *(byte *)(__n + local_3c);
        bVar1 = getMaxValue(this,dest._4_4_);
        if ((bVar1 != 0) || ((in_R9B & 1) != 0)) {
          if (bVar1 < local_3d) {
            local_3d = bVar1;
          }
          pBVar3[dest._4_4_] = local_3d;
        }
        dest._4_4_ = dest._4_4_ + 1;
      }
    }
  }
  return uVar2;
}

Assistant:

void MemoryRegion::write(unsigned int entry, unsigned int off, const Bit8u *src, unsigned int len, bool init) const {
	unsigned int memOff = entry * entrySize + off;
	// This method should never be called with out-of-bounds parameters,
	// or on an unsupported region - seeing any of this debug output indicates a bug in the emulator
	if (off > entrySize * entries - 1) {
#if MT32EMU_MONITOR_SYSEX > 0
		synth->printDebug("write[%d]: parameters start out of bounds: entry=%d, off=%d, len=%d", type, entry, off, len);
#endif
		return;
	}
	if (off + len > entrySize * entries) {
#if MT32EMU_MONITOR_SYSEX > 0
		synth->printDebug("write[%d]: parameters end out of bounds: entry=%d, off=%d, len=%d", type, entry, off, len);
#endif
		len = entrySize * entries - off;
	}
	Bit8u *dest = getRealMemory();
	if (dest == NULL) {
#if MT32EMU_MONITOR_SYSEX > 0
		synth->printDebug("write[%d]: unwritable region: entry=%d, off=%d, len=%d", type, entry, off, len);
#endif
		return;
	}

	for (unsigned int i = 0; i < len; i++) {
		Bit8u desiredValue = src[i];
		Bit8u maxValue = getMaxValue(memOff);
		// maxValue == 0 means write-protected unless called from initialisation code, in which case it really means the maximum value is 0.
		if (maxValue != 0 || init) {
			if (desiredValue > maxValue) {
#if MT32EMU_MONITOR_SYSEX > 0
				synth->printDebug("write[%d]: Wanted 0x%02x at %d, but max 0x%02x", type, desiredValue, memOff, maxValue);
#endif
				desiredValue = maxValue;
			}
			dest[memOff] = desiredValue;
		} else if (desiredValue != 0) {
#if MT32EMU_MONITOR_SYSEX > 0
			// Only output debug info if they wanted to write non-zero, since a lot of things cause this to spit out a lot of debug info otherwise.
			synth->printDebug("write[%d]: Wanted 0x%02x at %d, but write-protected", type, desiredValue, memOff);
#endif
		}
		memOff++;
	}
}